

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

timestamp_t __thiscall SpikesConsumer::getData(SpikesConsumer *this,spikePacket *packet)

{
  uint uVar1;
  long lVar2;
  const_iterator __position;
  size_t sVar3;
  iterator __last;
  int64_t iVar4;
  vector<int2d,_std::allocator<int2d>_> *in_RSI;
  HFSubConsumer *in_RDI;
  timestamp_t tVar5;
  int2d *ptr;
  int npoints;
  vector<int2d,_std::allocator<int2d>_> *this_00;
  __normal_iterator<const_int2d_*,_std::vector<int2d,_std::allocator<int2d>_>_> *this_01;
  size_type in_stack_ffffffffffffffb8;
  vector<int2d,_std::allocator<int2d>_> *in_stack_ffffffffffffffc0;
  int2d *in_stack_ffffffffffffffc8;
  vector<int2d,_std::allocator<int2d>_> *this_02;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar6;
  
  (*(in_RDI->super_HighFreqSub)._vptr_HighFreqSub[5])
            (in_RDI,*(undefined8 *)((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8),
             *(undefined8 *)&in_RDI[1].super_HighFreqSub.dt.dataFormat);
  this_01 = *(__normal_iterator<const_int2d_*,_std::vector<int2d,_std::allocator<int2d>_>_> **)
             ((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8);
  this_00 = in_RSI;
  sVar3 = spikePacket::headersize();
  memcpy(this_00,this_01,sVar3);
  lVar2 = *(long *)((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8);
  sVar3 = spikePacket::headersize();
  uVar6 = *(undefined4 *)(lVar2 + sVar3);
  lVar2 = *(long *)((long)&in_RDI[1].super_HighFreqSub.dt.origin.field_2 + 8);
  sVar3 = spikePacket::headersize();
  this_02 = (vector<int2d,_std::allocator<int2d>_> *)(lVar2 + 4 + sVar3);
  std::vector<int2d,_std::allocator<int2d>_>::reserve
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::vector<int2d,_std::allocator<int2d>_>::clear
            ((vector<int2d,_std::allocator<int2d>_> *)0x1cdeed);
  __last = std::vector<int2d,_std::allocator<int2d>_>::end(this_00);
  __gnu_cxx::__normal_iterator<int2d_const*,std::vector<int2d,std::allocator<int2d>>>::
  __normal_iterator<int2d*>
            (this_01,(__normal_iterator<int2d_*,_std::vector<int2d,_std::allocator<int2d>_>_> *)
                     this_00);
  __position._M_current._4_4_ = uVar6;
  __position._M_current._0_4_ = in_stack_ffffffffffffffd8;
  std::vector<int2d,std::allocator<int2d>>::insert<int2d*,void>
            (this_02,__position,in_stack_ffffffffffffffc8,__last._M_current);
  uVar1 = *(uint *)(in_RSI + 8);
  iVar4 = HFSubConsumer::lastSysTimestamp(in_RDI);
  tVar5._4_4_ = 0;
  tVar5.trodes_timestamp = uVar1;
  tVar5.system_timestamp = iVar4;
  return tVar5;
}

Assistant:

timestamp_t SpikesConsumer::getData(spikePacket* packet){
    //Can't just memcpy buffer into the packet, have to do it in chunks b/c of std::vector waveform
    //Get "header" info (ntrode, cluster, timestamp)
    readData(tempbuffer, tempbufsize);
    memcpy(packet, tempbuffer, spikePacket::headersize());
    //get waveform points
    int npoints = *(int*)(tempbuffer + spikePacket::headersize());
    int2d* ptr = (int2d*)(tempbuffer + spikePacket::headersize() + sizeof(int));
    packet->points.reserve(npoints);
    packet->points.clear();
    packet->points.insert(packet->points.end(), ptr, ptr+npoints);
    return {packet->timestamp, lastSysTimestamp()};
}